

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

CompoundStmt * __thiscall Parser::compound_statement(Parser *this)

{
  bool bVar1;
  pointer pCVar2;
  Stmt *local_38;
  Stmt *s;
  unique_ptr<CompoundStmt,_std::default_delete<CompoundStmt>_> local_20;
  __single_object b;
  Parser *this_local;
  
  b._M_t.super___uniq_ptr_impl<CompoundStmt,_std::default_delete<CompoundStmt>_>._M_t.
  super__Tuple_impl<0UL,_CompoundStmt_*,_std::default_delete<CompoundStmt>_>.
  super__Head_base<0UL,_CompoundStmt_*,_false>._M_head_impl =
       (__uniq_ptr_data<CompoundStmt,_std::default_delete<CompoundStmt>,_true,_true>)
       (__uniq_ptr_data<CompoundStmt,_std::default_delete<CompoundStmt>,_true,_true>)this;
  std::make_unique<CompoundStmt>();
  bVar1 = is_punctuator(this,'{');
  if (!bVar1) {
    error<char_const(&)[31]>(this,(char (*) [31])"expecting \'{\' to start a block");
  }
  next_token(this);
  do {
    if (this->tok->kind == Eof) {
      error<char_const(&)[25]>(this,(char (*) [25])"expecting \'}\' before EOF");
      this_local = (Parser *)0x0;
LAB_00125d8b:
      s._0_4_ = 1;
      std::unique_ptr<CompoundStmt,_std::default_delete<CompoundStmt>_>::~unique_ptr(&local_20);
      return (CompoundStmt *)this_local;
    }
    bVar1 = is_punctuator(this,'}');
    if (bVar1) {
      this_local = (Parser *)
                   std::unique_ptr<CompoundStmt,_std::default_delete<CompoundStmt>_>::release
                             (&local_20);
      goto LAB_00125d8b;
    }
    local_38 = statement(this);
    if (local_38 == (Stmt *)0x0) {
      this_local = (Parser *)0x0;
      goto LAB_00125d8b;
    }
    pCVar2 = std::unique_ptr<CompoundStmt,_std::default_delete<CompoundStmt>_>::operator->
                       (&local_20);
    std::vector<Stmt_*,_std::allocator<Stmt_*>_>::push_back(&pCVar2->stmts,&local_38);
  } while( true );
}

Assistant:

CompoundStmt* Parser::compound_statement()
{
  auto b = std::make_unique<CompoundStmt>();

  if (!is_punctuator('{'))
    error("expecting '{' to start a block");

  next_token();                 // Skip '{'

  while (tok->kind != TokenKind::Eof) {
    if (is_punctuator('}')) {
      return b.release();
    }
    else {
      auto s = statement();
      if (s)
        b->stmts.push_back(s);
      else
        return nullptr;
    }
  }

  error("expecting '}' before EOF");
  return nullptr;
}